

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_msg_generator.c
# Opt level: O3

rfc5444_result
rfc5444_writer_forward_msg
          (rfc5444_writer *writer,rfc5444_reader_tlvblock_context *context,uint8_t *msg,size_t len)

{
  char cVar1;
  byte bVar2;
  rfc5444_result rVar3;
  int iVar4;
  avl_node *paVar5;
  uint uVar6;
  bool bVar7;
  void *__dest;
  rfc5444_writer_target *prVar8;
  list_entity *plVar9;
  long lVar10;
  list_entity *plVar11;
  ulong uVar12;
  size_t msg_size;
  size_t generic_size;
  ulong local_68;
  size_t local_60;
  size_t local_58;
  rfc5444_reader_tlvblock_context *local_50;
  avl_node *local_48;
  long local_40;
  ulong local_38;
  
  if (writer->_state != RFC5444_WRITER_NONE) {
    __assert_fail("writer->_state == RFC5444_WRITER_NONE",
                  "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/librfc5444/rfc5444_msg_generator.c"
                  ,0x1d1,
                  "enum rfc5444_result rfc5444_writer_forward_msg(struct rfc5444_writer *, struct rfc5444_reader_tlvblock_context *, const uint8_t *, size_t)"
                 );
  }
  paVar5 = avl_find(&writer->_msgcreators,&context->msg_type);
  if (paVar5 == (avl_node *)0x0) {
    rVar3 = RFC5444_NO_MSGCREATOR;
  }
  else {
    rVar3 = RFC5444_OKAY;
    if ((paVar5[4].list.prev != (list_entity *)0x0) &&
       (plVar9 = (writer->_targets).next, rVar3 = RFC5444_OKAY,
       plVar9->prev != (writer->_targets).prev)) {
      prVar8 = (rfc5444_writer_target *)(plVar9 + -3);
      bVar7 = false;
      local_50 = context;
      local_48 = paVar5;
      do {
        cVar1 = (*(code *)paVar5[4].list.prev)(prVar8,context);
        if (cVar1 != '\0') {
          plVar11 = (writer->_forwarding_processors).list_head.next;
          if (plVar11->prev == (writer->_forwarding_processors).list_head.prev) {
            lVar10 = 0;
          }
          else {
            lVar10 = 0;
            do {
              cVar1 = (*(code *)plVar11[4].next)(plVar11,*msg);
              if (cVar1 != '\0') {
                lVar10 = lVar10 + (ulong)*(ushort *)((long)&plVar11[3].prev + 4);
              }
              plVar11 = plVar11->next;
            } while (plVar11->prev != (writer->_forwarding_processors).list_head.prev);
          }
          bVar2 = *(byte *)&plVar9[1].next;
          if (bVar2 == 0) {
            uVar12 = (long)plVar9[4].next -
                     ((long)&(plVar9[4].prev)->next +
                     (long)&(plVar9[2].prev)->next +
                     (long)&(plVar9[2].next)->next + (long)&(plVar9[3].next)->next);
            if (uVar12 < len + lVar10) {
              rfc5444_writer_flush(writer,prVar8,false);
              bVar2 = *(byte *)&plVar9[1].next;
            }
          }
          else {
            uVar12 = 0;
          }
          if ((bVar2 & 1) != 0) {
            _rfc5444_writer_begin_packet(writer,prVar8);
            uVar12 = (long)plVar9[4].next -
                     ((long)&(plVar9[4].prev)->next +
                     (long)&(plVar9[2].prev)->next +
                     (long)&(plVar9[2].next)->next + (long)&(plVar9[3].next)->next);
          }
          bVar7 = true;
          paVar5 = local_48;
          context = local_50;
          if (uVar12 < lVar10 + len) {
            return RFC5444_FW_MESSAGE_TOO_LONG;
          }
        }
        plVar9 = plVar9->next;
        prVar8 = (rfc5444_writer_target *)(plVar9 + -3);
      } while (plVar9->prev != (writer->_targets).prev);
      rVar3 = RFC5444_OKAY;
      if (bVar7) {
        memcpy(_msg_buffer,(writer->_msg).buffer,len);
        plVar9 = (writer->_forwarding_processors).list_head.next;
        local_58 = len;
        if (plVar9->prev != (writer->_forwarding_processors).list_head.prev) {
          do {
            cVar1 = (*(code *)plVar9[4].next)(plVar9,*msg);
            if ((cVar1 != '\0') && (*(char *)((long)&plVar9[3].prev + 6) == '\0')) {
              iVar4 = (*(code *)plVar9[4].prev)(plVar9,prVar8,context,_msg_buffer,&local_58);
              if (iVar4 != 0) {
                return RFC5444_FW_BAD_TRANSFORM;
              }
              if (local_58 == 0) goto LAB_00150211;
            }
            plVar9 = plVar9->next;
          } while (plVar9->prev != (writer->_forwarding_processors).list_head.prev);
        }
        bVar2 = msg[1];
        uVar6 = 4;
        if ((char)bVar2 < '\0') {
          uVar6 = (uint)(byte)((bVar2 & 0xf) + 5);
        }
        local_38 = (ulong)uVar6;
        local_68 = (ulong)bVar2 & 0xffffffff00000040;
        if ((((bVar2 & 0x40) == 0) || (1 < msg[local_38])) &&
           (plVar9 = (writer->_targets).next, plVar9->prev != (writer->_targets).prev)) {
          local_40 = (ulong)uVar6 + (local_68 >> 6);
          do {
            prVar8 = (rfc5444_writer_target *)(plVar9 + -3);
            cVar1 = (*(code *)local_48[4].list.prev)(prVar8,local_50);
            if (cVar1 != '\0') {
              __dest = (void *)((long)&(plVar9[4].prev)->next +
                               (long)&(plVar9[2].prev)->next +
                               (long)&(plVar9[3].next)->next +
                               (long)&(plVar9[1].prev)->next + (long)plVar9[2].next);
              if ((ulong)((long)&(plVar9[1].prev)->next + (long)plVar9[4].next) <
                  local_58 + (long)__dest) {
                __assert_fail("ptr + generic_size <= target->_pkt.buffer + target->_pkt.max",
                              "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/librfc5444/rfc5444_msg_generator.c"
                              ,0x244,
                              "enum rfc5444_result rfc5444_writer_forward_msg(struct rfc5444_writer *, struct rfc5444_reader_tlvblock_context *, const uint8_t *, size_t)"
                             );
              }
              memcpy(__dest,msg,local_58);
              local_60 = local_58;
              plVar11 = (writer->_forwarding_processors).list_head.next;
              if (plVar11->prev != (writer->_forwarding_processors).list_head.prev) {
                do {
                  cVar1 = (*(code *)plVar11[4].next)(plVar11,*msg);
                  if ((cVar1 != '\0') && (*(char *)((long)&plVar11[3].prev + 6) == '\x01')) {
                    iVar4 = (*(code *)plVar11[4].prev)(plVar11,prVar8,local_50,__dest,&local_60);
                    if (iVar4 != 0) {
                      return RFC5444_FW_BAD_TRANSFORM;
                    }
                    if (local_60 == 0) goto LAB_001501fb;
                  }
                  plVar11 = plVar11->next;
                } while (plVar11->prev != (writer->_forwarding_processors).list_head.prev);
              }
              if (local_60 != 0) {
                plVar9[4].prev = (list_entity *)((long)&(plVar9[4].prev)->next + local_60);
                *(char *)((long)__dest + 2) = (char)(local_60 >> 8);
                *(undefined1 *)((long)__dest + 3) = (undefined1)local_60;
                if ((int)local_68 != 0) {
                  *(char *)((long)__dest + local_38) = *(char *)((long)__dest + local_38) + -1;
                }
                if ((bVar2 & 0x20) != 0) {
                  *(char *)((long)__dest + local_40) = *(char *)((long)__dest + local_40) + '\x01';
                }
                if (writer->message_generation_notifier !=
                    (_func_void_rfc5444_writer_target_ptr *)0x0) {
                  (*writer->message_generation_notifier)(prVar8);
                }
              }
            }
LAB_001501fb:
            plVar9 = plVar9->next;
          } while (plVar9->prev != (writer->_targets).prev);
        }
LAB_00150211:
        rVar3 = RFC5444_OKAY;
      }
    }
  }
  return rVar3;
}

Assistant:

enum rfc5444_result
rfc5444_writer_forward_msg(
  struct rfc5444_writer *writer, struct rfc5444_reader_tlvblock_context *context, const uint8_t *msg, size_t len)
{
  struct rfc5444_writer_target *target;
  struct rfc5444_writer_message *rfc5444_msg;
  struct rfc5444_writer_forward_handler *handler;
  int cnt, hopcount, hoplimit;
  size_t max, transformer_overhead;
  size_t generic_size, msg_size;
  uint8_t flags, addr_len;
  uint8_t *ptr;
  bool shall_forward;
#if WRITER_STATE_MACHINE == true
  assert(writer->_state == RFC5444_WRITER_NONE);
#endif

  rfc5444_msg = avl_find_element(&writer->_msgcreators, &context->msg_type, rfc5444_msg, _msgcreator_node);
  if (rfc5444_msg == NULL) {
    /* error, no msgcreator found */
    return RFC5444_NO_MSGCREATOR;
  }

  if (!rfc5444_msg->forward_target_selector) {
    /* no forwarding handler, do not forward */
    return RFC5444_OKAY;
  }

  /* 1.) first flush all interfaces that have (too) full buffers */
  shall_forward = false;
  list_for_each_element(&writer->_targets, target, _target_node) {
    if (!rfc5444_msg->forward_target_selector(target, context)) {
      continue;
    }

    shall_forward = true;
    transformer_overhead = 0;
    avl_for_each_element(&writer->_forwarding_processors, handler, _node) {
      if (handler->is_matching_signature(handler, msg[0])) {
        transformer_overhead += handler->allocate_space;
      }
    }

    max = 0;
    if (!target->_is_flushed) {
      max =
        target->_pkt.max - (target->_pkt.header + target->_pkt.added + target->_pkt.allocated + target->_bin_msgs_size);

      if (len + transformer_overhead > max) {
        /* flush the old packet */
        rfc5444_writer_flush(writer, target, false);
      }
    }

    if (target->_is_flushed) {
      /* begin a new packet */
      _rfc5444_writer_begin_packet(writer, target);
      max =
        target->_pkt.max - (target->_pkt.header + target->_pkt.added + target->_pkt.allocated + target->_bin_msgs_size);
    }

    if (len + transformer_overhead > max) {
      /* message too long, too much data in it */
      return RFC5444_FW_MESSAGE_TOO_LONG;
    }
  }

  if (!shall_forward) {
    /* no target to forward message, everything done */
    return RFC5444_OKAY;
  }

  /* 2.) generate message and do non-target specific post processors */
  ptr = _msg_buffer;
  memcpy(ptr, writer->_msg.buffer, len);

  /* remember length */
  generic_size = len;

  /* run processors (unpspecific) forwarding processors */
  avl_for_each_element(&writer->_forwarding_processors, handler, _node) {
    if (handler->is_matching_signature(handler, msg[0]) && !handler->target_specific) {
      if (handler->process(handler, target, context, _msg_buffer, &generic_size)) {
        /* error, we have not modified the _bin_msgs_size, so we can just return */
        return RFC5444_FW_BAD_TRANSFORM;
      }

      if (generic_size == 0) {
        return RFC5444_OKAY;
      }
    }
  }

  /* 3) grab index of header structures */
  flags = msg[1];
  addr_len = (flags & RFC5444_MSG_FLAG_ADDRLENMASK) + 1;

  cnt = 4;
  hopcount = -1;
  hoplimit = -1;

  if ((flags & RFC5444_MSG_FLAG_ORIGINATOR) != 0) {
    cnt += addr_len;
  }
  if ((flags & RFC5444_MSG_FLAG_HOPLIMIT) != 0) {
    hoplimit = cnt++;
  }
  if ((flags & RFC5444_MSG_FLAG_HOPCOUNT) != 0) {
    hopcount = cnt++;
  }
  if ((flags & RFC5444_MSG_FLAG_SEQNO) != 0) {
    cnt += 2;
  }

  if (hoplimit != -1 && msg[hoplimit] <= 1) {
    /* do not forward a message with hopcount 1 or 0 */
    return RFC5444_OKAY;
  }

  /* forward message */
  list_for_each_element(&writer->_targets, target, _target_node) {
    if (!rfc5444_msg->forward_target_selector(target, context)) {
      continue;
    }

    ptr =
      &target->_pkt.buffer[target->_pkt.header + target->_pkt.added + target->_pkt.allocated + target->_bin_msgs_size];

    /* copy message into packet buffer */
    assert(ptr + generic_size <= target->_pkt.buffer + target->_pkt.max);
    memcpy(ptr, msg, generic_size);

    /* remember position of first copy */
    msg_size = generic_size;

    /* run processors */
    avl_for_each_element(&writer->_forwarding_processors, handler, _node) {
      if (handler->is_matching_signature(handler, msg[0]) && handler->target_specific) {
        if (handler->process(handler, target, context, ptr, &msg_size)) {
          /* error, we have not modified the _bin_msgs_size, so we can just return */
          return RFC5444_FW_BAD_TRANSFORM;
        }
        if (msg_size == 0) {
          break;
        }
      }
    }

    if (msg_size > 0) {
      target->_bin_msgs_size += msg_size;

      /* correct message */
      ptr[2] = msg_size >> 8;
      ptr[3] = msg_size & 0xff;

      /* correct hoplimit if necesssary */
      if (hoplimit != -1) {
        ptr[hoplimit]--;
      }

      /* correct hopcount if necessary */
      if (hopcount != -1) {
        ptr[hopcount]++;
      }

      if (writer->message_generation_notifier) {
        writer->message_generation_notifier(target);
      }
    }
  }
  return RFC5444_OKAY;
}